

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

void __thiscall
QtMWidgets::TableViewSection::insertCell(TableViewSection *this,int index,TableViewCell *cell)

{
  QVBoxLayout *pQVar1;
  uint uVar2;
  TableViewCell *pTVar3;
  int iVar4;
  TableViewSectionPrivate *pTVar5;
  qsizetype qVar6;
  RowsSeparator *pRVar7;
  TableViewSection *pTVar8;
  uint local_70;
  QFlags<Qt::AlignmentFlag> local_4c;
  RowsSeparator **local_48;
  QFlags<Qt::AlignmentFlag> local_40 [4];
  RowsSeparator *local_30;
  RowsSeparator *s;
  TableViewCell *pTStack_20;
  int actualIndex;
  TableViewCell *cell_local;
  TableViewSection *pTStack_10;
  int index_local;
  TableViewSection *this_local;
  
  if ((cell != (TableViewCell *)0x0) && (-1 < index)) {
    pTStack_20 = cell;
    cell_local._4_4_ = index;
    pTStack_10 = this;
    pTVar5 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
             ::operator->(&this->d);
    qVar6 = QList<QtMWidgets::TableViewCell_*>::size(&pTVar5->cells);
    if (qVar6 < index) {
      pTVar5 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
               ::operator->(&this->d);
      qVar6 = QList<QtMWidgets::TableViewCell_*>::size(&pTVar5->cells);
      cell_local._4_4_ = (int)qVar6;
    }
    iVar4 = cell_local._4_4_;
    if (cell_local._4_4_ == 0) {
      local_70 = 1;
    }
    else {
      pTVar5 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
               ::operator->(&this->d);
      qVar6 = QList<QtMWidgets::TableViewCell_*>::size(&pTVar5->cells);
      local_70 = iVar4 + (int)qVar6;
    }
    s._4_4_ = local_70;
    if (cell_local._4_4_ != 0) {
      pRVar7 = (RowsSeparator *)operator_new(0x28);
      RowsSeparator::RowsSeparator(pRVar7,&this->super_QWidget);
      local_30 = pRVar7;
      pTVar5 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
               ::operator->(&this->d);
      uVar2 = s._4_4_;
      pRVar7 = local_30;
      pQVar1 = pTVar5->layout;
      QFlags<Qt::AlignmentFlag>::QFlags(local_40);
      QBoxLayout::insertWidget
                ((int)pQVar1,(QWidget *)(ulong)uVar2,(int)pRVar7,(QFlags_conflict1 *)0x0);
      pTVar5 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
               ::operator->(&this->d);
      local_48 = (RowsSeparator **)
                 QList<QtMWidgets::RowsSeparator_*>::insert
                           (&pTVar5->separators,(long)(cell_local._4_4_ + -1),local_30);
      QWidget::show();
      s._4_4_ = s._4_4_ + 1;
    }
    pTVar8 = (TableViewSection *)QObject::parent((QObject *)pTStack_20);
    if (pTVar8 != this) {
      QWidget::setParent(&pTStack_20->super_QWidget);
    }
    pTVar5 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
             ::operator->(&this->d);
    pTVar3 = pTStack_20;
    uVar2 = s._4_4_;
    pQVar1 = pTVar5->layout;
    QFlags<Qt::AlignmentFlag>::QFlags(&local_4c);
    QBoxLayout::insertWidget
              ((int)pQVar1,(QWidget *)(ulong)uVar2,(int)pTVar3,(QFlags_conflict1 *)0x0);
    pTVar5 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
             ::operator->(&this->d);
    QList<QtMWidgets::TableViewCell_*>::insert(&pTVar5->cells,(long)cell_local._4_4_,pTStack_20);
    pTVar3 = pTStack_20;
    pTVar5 = QScopedPointer<QtMWidgets::TableViewSectionPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewSectionPrivate>_>
             ::operator->(&this->d);
    TableViewCell::setHighlightOnClick(pTVar3,(bool)(pTVar5->highlightCellOnClick & 1));
    QWidget::show();
  }
  return;
}

Assistant:

void
TableViewSection::insertCell( int index, TableViewCell * cell )
{
	if( !cell || index < 0 )
		return;

	if( index > d->cells.size() )
		index = d->cells.size();

	int actualIndex = ( index == 0 ? 1 : index + d->cells.size() );

	if( index != 0 )
	{
		RowsSeparator * s = new RowsSeparator( this );
		d->layout->insertWidget( actualIndex, s );
		d->separators.insert( index - 1, s );
		s->show();
		++actualIndex;
	}

	if( cell->parent() != this )
		cell->setParent( this );
	d->layout->insertWidget( actualIndex, cell );
	d->cells.insert( index, cell );
	cell->setHighlightOnClick( d->highlightCellOnClick );
	cell->show();
}